

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::mouseDoubleClickEvent(QTreeView *this,QMouseEvent *event)

{
  long lVar1;
  QTreeViewPrivate *this_00;
  char cVar2;
  bool bVar3;
  State SVar4;
  int iVar5;
  uint uVar6;
  QPoint QVar7;
  long lVar8;
  QStyle *pQVar9;
  ulong uVar10;
  QWidget *this_01;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QRect local_70;
  QPersistentModelIndex persistent;
  QPointF local_50;
  QPersistentModelIndex firstColumnIndex;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  SVar4 = QAbstractItemView::state((QAbstractItemView *)this);
  if (SVar4 != NoState) goto LAB_00544120;
  local_70 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).
                           super_QAbstractScrollAreaPrivate.viewport);
  local_50 = QSinglePointEvent::position((QSinglePointEvent *)event);
  firstColumnIndex.d = (QPersistentModelIndexData *)QPointF::toPoint(&local_50);
  cVar2 = QRect::contains((QPoint *)&local_70,SUB81(&firstColumnIndex,0));
  if (cVar2 == '\0') goto LAB_00544120;
  local_70 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)event);
  QVar7 = QPointF::toPoint((QPointF *)&local_70);
  local_50.xp = (qreal)QVar7;
  iVar5 = QTreeViewPrivate::itemDecorationAt(this_00,(QPoint *)&local_50);
  if (iVar5 != -1) goto LAB_00544120;
  local_70 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)event);
  QVar7 = QPointF::toPoint((QPointF *)&local_70);
  uVar6 = QTreeViewPrivate::itemAtCoordinate(this_00,QVar7.yp.m_i.m_i);
  if (uVar6 == 0xffffffff) goto LAB_00544120;
  uVar12 = (ulong)uVar6;
  firstColumnIndex.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  lVar8 = (long)(int)uVar6;
  QPersistentModelIndex::QPersistentModelIndex
            (&firstColumnIndex,&(this_00->viewItems).d.ptr[lVar8].index);
  persistent.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = QSinglePointEvent::position((QSinglePointEvent *)event);
  QPointF::toPoint(&local_50);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x1f0))((QModelIndex *)&local_70,this);
  QPersistentModelIndex::QPersistentModelIndex(&persistent,(QModelIndex *)&local_70);
  bVar3 = ::operator!=(&(this_00->super_QAbstractItemViewPrivate).pressedIndex,&persistent);
  if (bVar3) {
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x98))(this,event);
  }
  else {
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_70,&persistent);
    QAbstractItemView::doubleClicked((QAbstractItemView *)this,(QModelIndex *)&local_70);
    cVar2 = QPersistentModelIndex::isValid();
    if (cVar2 != '\0') {
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_70,&persistent);
      cVar2 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2e0))
                        (this,(QModelIndex *)&local_70,2,event);
      if (cVar2 == '\0') {
        SVar4 = QAbstractItemView::state((QAbstractItemView *)this);
        if (SVar4 == NoState) {
          pQVar9 = QWidget::style((QWidget *)this);
          iVar5 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x3d,0,this,0);
          if (iVar5 == 0) {
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      ((QModelIndex *)&local_70,&persistent);
            QAbstractItemView::activated((QAbstractItemView *)this,(QModelIndex *)&local_70);
          }
          (this_00->super_QAbstractItemViewPrivate).releaseFromDoubleClick = true;
          QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
          if ((this_00->itemsExpandable == true) && (this_00->expandsOnDoubleClick == true)) {
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      ((QModelIndex *)&local_70,&persistent);
            bVar3 = QTreeViewPrivate::hasVisibleChildren(this_00,(QModelIndex *)&local_70);
            if (bVar3) {
              if (lVar8 < (this_00->viewItems).d.size) {
                cVar2 = ::comparesEqual(&firstColumnIndex,&(this_00->viewItems).d.ptr[lVar8].index);
                if (cVar2 == '\0') goto LAB_0054406b;
              }
              else {
LAB_0054406b:
                lVar11 = 0;
                lVar8 = 0;
                for (uVar12 = 0; uVar10 = (this_00->viewItems).d.size, uVar12 < uVar10;
                    uVar12 = uVar12 + 1) {
                  cVar2 = ::comparesEqual(&firstColumnIndex,
                                          (QModelIndex *)
                                          ((long)&(((this_00->viewItems).d.ptr)->index).r + lVar11))
                  ;
                  if (cVar2 != '\0') {
                    uVar10 = (this_00->viewItems).d.size;
                    break;
                  }
                  lVar8 = lVar8 + 0x100000000;
                  lVar11 = lVar11 + 0x28;
                }
                if (uVar10 == uVar12) goto LAB_0054410c;
                lVar8 = lVar8 >> 0x20;
              }
              if (((this_00->viewItems).d.ptr[lVar8].field_0x1c & 1) == 0) {
                QTreeViewPrivate::expand(this_00,(int)uVar12,true);
              }
              else {
                QTreeViewPrivate::collapse(this_00,(int)uVar12,true);
              }
              (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x268))(this);
              this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
              QWidget::update(this_01);
            }
          }
        }
      }
    }
  }
LAB_0054410c:
  QPersistentModelIndex::~QPersistentModelIndex(&persistent);
  QPersistentModelIndex::~QPersistentModelIndex(&firstColumnIndex);
LAB_00544120:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    if (state() != NoState || !d->viewport->rect().contains(event->position().toPoint()))
        return;

    int i = d->itemDecorationAt(event->position().toPoint());
    if (i == -1) {
        i = d->itemAtCoordinate(event->position().toPoint().y());
        if (i == -1)
            return; // user clicked outside the items

        const QPersistentModelIndex firstColumnIndex = d->viewItems.at(i).index;
        const QPersistentModelIndex persistent = indexAt(event->position().toPoint());

        if (d->pressedIndex != persistent) {
            mousePressEvent(event);
            return;
        }

        // signal handlers may change the model
        emit doubleClicked(persistent);

        if (!persistent.isValid())
            return;

        if (edit(persistent, DoubleClicked, event) || state() != NoState)
            return; // the double click triggered editing

        if (!style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this))
            emit activated(persistent);

        d->releaseFromDoubleClick = true;
        d->executePostedLayout(); // we need to make sure viewItems is updated
        if (d->itemsExpandable
            && d->expandsOnDoubleClick
            && d->hasVisibleChildren(persistent)) {
            if (!((i < d->viewItems.size()) && (d->viewItems.at(i).index == firstColumnIndex))) {
                // find the new index of the item
                for (i = 0; i < d->viewItems.size(); ++i) {
                    if (d->viewItems.at(i).index == firstColumnIndex)
                        break;
                }
                if (i == d->viewItems.size())
                    return;
            }
            if (d->viewItems.at(i).expanded)
                d->collapse(i, true);
            else
                d->expand(i, true);
            updateGeometries();
            viewport()->update();
        }
    }
}